

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-invert-images.cc
# Opt level: O0

void __thiscall ImageInverter::ImageInverter(ImageInverter *this)

{
  ImageInverter *this_local;
  
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,false);
  *(undefined ***)this = &PTR__ImageInverter_0010cc40;
  std::
  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  ::map(&this->copied_images);
  return;
}

Assistant:

~ImageInverter() override = default;